

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# circular_array_numeric_suite.cpp
# Opt level: O2

void numeric_suite::test_adjacent_difference_back_inserter(void)

{
  basic_iterator<int> first_end;
  initializer_list<int> __l;
  initializer_list<int> __l_00;
  basic_iterator<int> first_begin;
  allocator_type local_89;
  vector<int,_std::allocator<int>_> expect;
  vector<int,_std::allocator<int>_> data;
  int local_48 [4];
  circular_array<int,_4UL> result;
  
  result.super_array<int,_4UL>._M_elems[0] = 0xb;
  result.super_array<int,_4UL>._M_elems[1] = 0x16;
  result.super_array<int,_4UL>._M_elems[2] = 0x21;
  result.super_array<int,_4UL>._M_elems[3] = 0x2c;
  result.super_circular_view<int,_4UL>.member.data =
       (pointer)CONCAT44(result.super_circular_view<int,_4UL>.member.data._4_4_,0x37);
  __l._M_len = 5;
  __l._M_array = (iterator)&result;
  std::vector<int,_std::allocator<int>_>::vector(&data,__l,(allocator_type *)&expect);
  result.super_circular_view<int,_4UL>.member.size = 0;
  result.super_circular_view<int,_4UL>.member.next = 4;
  result.super_circular_view<int,_4UL>.member.data = (pointer)&result;
  std::
  adjacent_difference<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,std::back_insert_iterator<vista::circular_array<int,4ul>>>
            ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
             data.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_start,(__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                      data.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish,&result);
  local_48[0] = 0xb;
  local_48[1] = 0xb;
  local_48[2] = 0xb;
  local_48[3] = 0xb;
  __l_00._M_len = 4;
  __l_00._M_array = local_48;
  std::vector<int,_std::allocator<int>_>::vector(&expect,__l_00,&local_89);
  first_begin.current._0_4_ =
       (uint)result.super_circular_view<int,_4UL>.member.next -
       (int)result.super_circular_view<int,_4UL>.member.size & 7;
  first_end.current._0_4_ = (uint)result.super_circular_view<int,_4UL>.member.next & 7;
  first_end.parent = &result.super_circular_view<int,_4UL>;
  first_end.current._4_4_ = 0;
  first_begin.parent = &result.super_circular_view<int,_4UL>;
  first_begin.current._4_4_ = 0;
  boost::detail::
  test_all_eq_impl<std::ostream,vista::circular_view<int,4ul>::basic_iterator<int>,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
            ((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_array_numeric_suite.cpp"
             ,0x34,"void numeric_suite::test_adjacent_difference_back_inserter()",first_begin,
             first_end,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
             expect.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_start,(__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                      expect.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&expect.super__Vector_base<int,_std::allocator<int>_>);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&data.super__Vector_base<int,_std::allocator<int>_>);
  return;
}

Assistant:

void test_adjacent_difference_back_inserter()
{
    std::vector<int> data = {11, 22, 33, 44, 55};
    circular_array<int, 4> result;
    std::adjacent_difference(data.begin(), data.end(), std::back_inserter(result));
    std::vector<int> expect = {22 - 11, 33 - 22, 44 - 33, 55 - 44};
    BOOST_TEST_ALL_EQ(result.begin(), result.end(), expect.begin(), expect.end());
}